

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::pred_per_update_feature<false,false,0ul,1ul,2ul,false>(norm_data *nd,float x,float *fw)

{
  vw_exception *this;
  weight *w;
  float fVar1;
  float fVar2;
  float fVar3;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if ((*fw != 0.0) || (NAN(*fw))) {
    fVar2 = x * x;
    fVar3 = 1.175494e-38;
    if (1.175494e-38 <= fVar2) {
      fVar3 = fVar2;
    }
    if (3.4028235e+38 < fVar3) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,"your features have too much magnitude",0x25);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                 ,500,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    fVar1 = ABS((float)(*(uint *)(&DAT_00274f60 + (ulong)(0.0 < x) * 4) &
                        -(uint)(fVar2 < 1.175494e-38) | ~-(uint)(fVar2 < 1.175494e-38) & (uint)x));
    fVar2 = fw[1];
    if (fVar2 < fVar1) {
      if (0.0 < fVar2) {
        fVar2 = powf((fVar1 / fVar2) * (fVar1 / fVar2),(nd->pd).neg_norm_power);
        *fw = fVar2 * *fw;
      }
      fw[1] = fVar1;
    }
    nd->norm_x = fVar3 / (fw[1] * fw[1]) + nd->norm_x;
    fVar2 = powf(fw[1] * fw[1],(nd->pd).neg_norm_power);
    fw[2] = fVar2;
    nd->pred_per_update = fVar3 * fVar2 + nd->pred_per_update;
  }
  return;
}

Assistant:

inline void pred_per_update_feature(norm_data& nd, float x, float& fw)
{
  if (feature_mask_off || fw != 0.)
  {
    weight* w = &fw;
    float x2 = x * x;
    if (x2 < x2_min)
    {
      x = (x > 0) ? x_min : -x_min;
      x2 = x2_min;
    }
    if (x2 > x2_max)
      THROW("your features have too much magnitude");
    if (stateless)  // we must not modify the parameter state so introduce a shadow version.
    {
      nd.extra_state[0] = w[0];
      nd.extra_state[adaptive] = w[adaptive];
      nd.extra_state[normalized] = w[normalized];
      w = nd.extra_state;
    }
    if (adaptive)
      w[adaptive] += nd.grad_squared * x2;
    if (normalized)
    {
      float x_abs = fabsf(x);
      if (x_abs > w[normalized])  // new scale discovered
      {
        if (w[normalized] >
            0.)  // If the normalizer is > 0 then rescale the weight so it's as if the new scale was the old scale.
        {
          if (sqrt_rate)
          {
            float rescale = w[normalized] / x_abs;
            w[0] *= (adaptive ? rescale : rescale * rescale);
          }
          else
          {
            float rescale = x_abs / w[normalized];
            w[0] *= powf(rescale * rescale, nd.pd.neg_norm_power);
          }
        }
        w[normalized] = x_abs;
      }
      nd.norm_x += x2 / (w[normalized] * w[normalized]);
    }
    w[spare] = compute_rate_decay<sqrt_rate, adaptive, normalized>(nd.pd, w[0]);
    nd.pred_per_update += x2 * w[spare];
  }
}